

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O1

string * __thiscall
duckdb::TableFilter::DebugToString_abi_cxx11_(string *__return_storage_ptr__,TableFilter *this)

{
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"c0","");
  (*this->_vptr_TableFilter[3])(__return_storage_ptr__,this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string TableFilter::DebugToString() const {
	return ToString("c0");
}